

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutOracle.c
# Opt level: O1

void Cut_OracleStop(Cut_Oracle_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  int level;
  
  puts("Cut computation statistics with oracle:");
  level = 0x9c861a;
  printf("Current cuts      = %8d. (Trivial = %d.)\n",(ulong)(uint)(p->nCuts - p->nCutsTriv));
  Abc_Print(level,"%s =","Total time ");
  Abc_Print(level,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  pVVar1 = p->vCuts0;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vCuts1;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vCutsNew;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar2 = p->vFanCounts;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    free(pVVar2);
  }
  pVVar2 = p->vNodeCuts;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    free(pVVar2);
  }
  pVVar2 = p->vNodeStarts;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    free(pVVar2);
  }
  pVVar2 = p->vCutPairs;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    if (pVVar2->pArray != (int *)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (int *)0x0;
    }
    free(pVVar2);
  }
  Extra_MmFixedStop(p->pMmCuts);
  if (p != (Cut_Oracle_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Cut_OracleStop( Cut_Oracle_t * p )
{
//    if ( p->pParams->fVerbose )
    {
        printf( "Cut computation statistics with oracle:\n" );
        printf( "Current cuts      = %8d. (Trivial = %d.)\n", p->nCuts-p->nCutsTriv, p->nCutsTriv );
        ABC_PRT( "Total time ", p->timeTotal );
    }

    if ( p->vCuts0 )      Vec_PtrFree( p->vCuts0 );
    if ( p->vCuts1 )      Vec_PtrFree( p->vCuts1 );
    if ( p->vCutsNew )    Vec_PtrFree( p->vCutsNew );
    if ( p->vFanCounts )  Vec_IntFree( p->vFanCounts );

    if ( p->vNodeCuts )   Vec_IntFree( p->vNodeCuts );
    if ( p->vNodeStarts ) Vec_IntFree( p->vNodeStarts );
    if ( p->vCutPairs )   Vec_IntFree( p->vCutPairs );

    Extra_MmFixedStop( p->pMmCuts );
    ABC_FREE( p ); 
}